

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::release_resources(HL1MDLLoader *this)

{
  uchar *puVar1;
  long lVar2;
  
  puVar1 = this->texture_buffer_;
  if (this->buffer_ != puVar1) {
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
    this->texture_buffer_ = (uchar *)0x0;
  }
  if ((this->num_sequence_groups_ != 0) && (this->anim_buffers_ != (uchar **)0x0)) {
    if (1 < this->num_sequence_groups_) {
      lVar2 = 1;
      do {
        if (this->anim_buffers_[lVar2] != (uchar *)0x0) {
          operator_delete__(this->anim_buffers_[lVar2]);
          this->anim_buffers_[lVar2] = (uchar *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->num_sequence_groups_);
    }
    if (this->anim_buffers_ != (uchar **)0x0) {
      operator_delete__(this->anim_buffers_);
    }
    this->anim_buffers_ = (uchar **)0x0;
  }
  if (this->anim_headers_ != (SequenceHeader_HL1 **)0x0) {
    operator_delete__(this->anim_headers_);
    this->anim_headers_ = (SequenceHeader_HL1 **)0x0;
  }
  return;
}

Assistant:

void HL1MDLLoader::release_resources() {
    if (buffer_ != texture_buffer_) {
        delete[] texture_buffer_;
        texture_buffer_ = nullptr;
    }

    if (num_sequence_groups_ && anim_buffers_) {
        for (int i = 1; i < num_sequence_groups_; ++i) {
            if (anim_buffers_[i]) {
                delete[] anim_buffers_[i];
                anim_buffers_[i] = nullptr;
            }
        }

        delete[] anim_buffers_;
        anim_buffers_ = nullptr;
    }

    if (anim_headers_) {
        delete[] anim_headers_;
        anim_headers_ = nullptr;
    }
}